

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O0

type cm::operator==(char **l,
                   StringOpPlus<const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   *r)

{
  type tVar1;
  string local_48;
  string_view local_28;
  StringOpPlus<const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_18;
  StringOpPlus<const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *r_local;
  char **l_local;
  
  local_18 = r;
  r_local = (StringOpPlus<const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
             *)l;
  local_28 = AsStringView<char_*>::view(*l);
  StringOpPlus::operator_cast_to_string(&local_48,(StringOpPlus *)local_18);
  tVar1 = operator==(&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return tVar1;
}

Assistant:

typename std::enable_if<AsStringView<L>::value, bool>::type operator==(
  L&& l, StringOpPlus<RL, RR> const& r)
{
  return AsStringView<L>::view(std::forward<L>(l)) == std::string(r);
}